

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssembly.cpp
# Opt level: O0

bool Js::WebAssembly::IsResponseObject(Var responseObject,ScriptContext *scriptContext)

{
  bool bVar1;
  TypeId typeId_00;
  RecyclableObject *this;
  bool local_25;
  TypeId typeId;
  ScriptContext *scriptContext_local;
  Var responseObject_local;
  
  bVar1 = VarIs<Js::RecyclableObject>(responseObject);
  if (bVar1) {
    this = VarTo<Js::RecyclableObject>(responseObject);
    typeId_00 = RecyclableObject::GetTypeId(this);
    if ((DAT_01e9e244 & 1) == 0) {
      local_25 = ScriptContext::IsWellKnownHostType<(WellKnownHostType)1>(scriptContext,typeId_00);
      local_25 = local_25 && typeId_00 != TypeIds_Undefined;
      responseObject_local._7_1_ = local_25;
    }
    else {
      responseObject_local._7_1_ = typeId_00 == TypeIds_Object;
    }
  }
  else {
    responseObject_local._7_1_ = false;
  }
  return responseObject_local._7_1_;
}

Assistant:

bool WebAssembly::IsResponseObject(Var responseObject, ScriptContext* scriptContext)
{
    if (!VarIs<RecyclableObject>(responseObject))
    {
        return false;
    }
    TypeId typeId = VarTo<RecyclableObject>(responseObject)->GetTypeId();
    if (!CONFIG_FLAG(WasmIgnoreResponse))
    {
        return scriptContext->IsWellKnownHostType<WellKnownHostType_Response>(typeId) && typeId != TypeIds_Undefined;
    }
    // Consider all object as Response objects under -wasmIgnoreResponse
    return typeId == TypeIds_Object;
}